

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp.c
# Opt level: O0

void on_bytes_received(void *context,uchar *buffer,size_t len)

{
  int iVar1;
  HTTP_HEADERS_RESULT HVar2;
  BUFFER_HANDLE pBVar3;
  LOGGER_LOG p_Var4;
  LOGGER_LOG in_stack_fffffffffffffea8;
  undefined4 uVar5;
  LOGGER_LOG l_11;
  LOGGER_LOG l_10;
  char *header;
  size_t index_2;
  size_t count;
  LOGGER_LOG l_9;
  size_t sStack_108;
  HTTP_CALLBACK_REASON http_reason;
  size_t reply_len;
  uchar *reply_data;
  LOGGER_LOG l_8;
  size_t shrink_len;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  size_t hex_len;
  size_t data_length;
  size_t accural_len;
  uchar *end;
  uchar *begin;
  uchar *initial_pos;
  uchar *iterator;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  size_t stored_len_2;
  LOGGER_LOG l_2;
  size_t sStack_70;
  int headerComplete;
  size_t stored_len_1;
  uchar *stored_bytes_1;
  size_t index_1;
  LOGGER_LOG l_1;
  size_t sStack_48;
  int lineComplete;
  size_t stored_len;
  uchar *stored_bytes;
  size_t index;
  LOGGER_LOG l;
  HTTP_CLIENT_HANDLE_DATA *http_data;
  size_t len_local;
  uchar *buffer_local;
  void *context_local;
  
  if ((((context != (void *)0x0) && (buffer != (uchar *)0x0)) && (len != 0)) &&
     (*(int *)((long)context + 0x4c) != 0xb)) {
    l = (LOGGER_LOG)context;
    http_data = (HTTP_CLIENT_HANDLE_DATA *)len;
    len_local = (size_t)buffer;
    buffer_local = (uchar *)context;
    if (*(int *)((long)context + 0x4c) == 8) {
      setup_init_recv_msg((HTTP_RECV_DATA *)((long)context + 0x38));
    }
    if ((*(int *)(l + 0x4c) == 0) || (*(int *)(l + 0x4c) == 2)) {
      iVar1 = initialize_received_data((HTTP_CLIENT_HANDLE_DATA *)l);
      if (iVar1 == 0) {
        *(undefined4 *)(l + 0x4c) = 3;
      }
      else {
        *(undefined4 *)(l + 0x4c) = 0xb;
      }
    }
    iVar1 = BUFFER_append_build(*(BUFFER_HANDLE *)(l + 0x68),(uchar *)len_local,(size_t)http_data);
    if (iVar1 != 0) {
      index = (size_t)xlogging_get_log_function();
      if ((LOGGER_LOG)index != (LOGGER_LOG)0x0) {
        (*(code *)index)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                         ,"on_bytes_received",0x211,1,"Failure appending bytes to buffer.");
      }
      *(undefined4 *)(l + 0x4c) = 0xb;
    }
    if (*(int *)(l + 0x4c) == 3) {
      stored_bytes = (uchar *)0x0;
      stored_len = (size_t)BUFFER_u_char(*(BUFFER_HANDLE *)(l + 0x68));
      sStack_48 = BUFFER_length(*(BUFFER_HANDLE *)(l + 0x68));
      l_1._4_4_ = process_status_code_line
                            ((uchar *)stored_len,sStack_48,(size_t *)&stored_bytes,(int *)(l + 0x48)
                            );
      if ((l_1._4_4_ == 0) && (0 < *(int *)(l + 0x48))) {
        iVar1 = BUFFER_shrink(*(BUFFER_HANDLE *)(l + 0x68),(size_t)stored_bytes,false);
        if (iVar1 == 0) {
          *(undefined4 *)(l + 0x4c) = 4;
        }
        else {
          index_1 = (size_t)xlogging_get_log_function();
          if ((LOGGER_LOG)index_1 != (LOGGER_LOG)0x0) {
            (*(code *)index_1)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                               ,"on_bytes_received",0x220,1,"Failure appending bytes to buffer.");
          }
          *(undefined4 *)(l + 0x4c) = 0xb;
        }
      }
    }
    if (*(int *)(l + 0x4c) == 4) {
      stored_bytes_1 = (uchar *)0x0;
      stored_len_1 = (size_t)BUFFER_u_char(*(BUFFER_HANDLE *)(l + 0x68));
      sStack_70 = BUFFER_length(*(BUFFER_HANDLE *)(l + 0x68));
      l_2._4_4_ = process_header_line((uchar *)stored_len_1,sStack_70,(size_t *)&stored_bytes_1,
                                      *(HTTP_HEADERS_HANDLE *)(l + 0x50),(size_t *)(l + 0x60),
                                      (_Bool *)(l + 0x70));
      if (l_2._4_4_ == 0) {
        if (*(long *)(l + 0x60) == 0) {
          if (((byte)l[0x70] & 1) == 0) {
            *(undefined4 *)(l + 0x4c) = 7;
          }
          else {
            *(undefined4 *)(l + 0x4c) = 6;
          }
        }
        else {
          *(undefined4 *)(l + 0x4c) = 5;
        }
      }
      if ((stored_bytes_1 != (uchar *)0x0) &&
         (iVar1 = BUFFER_shrink(*(BUFFER_HANDLE *)(l + 0x68),(size_t)stored_bytes_1,false),
         iVar1 != 0)) {
        stored_len_2 = (size_t)xlogging_get_log_function();
        if ((LOGGER_LOG)stored_len_2 != (LOGGER_LOG)0x0) {
          (*(code *)stored_len_2)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                     ,"on_bytes_received",0x24a,1,"Failure appending bytes to buffer.");
        }
        *(undefined4 *)(l + 0x4c) = 0xb;
      }
    }
    if ((*(int *)(l + 0x4c) == 5) && (*(long *)(l + 0x60) != 0)) {
      l_3 = (LOGGER_LOG)BUFFER_length(*(BUFFER_HANDLE *)(l + 0x68));
      if ((*(LOGGER_LOG *)(l + 0x60) == l_3) || (*(code **)(l + 0x60) == l_3 + -4)) {
        if (*(long *)(l + 0x58) != 0) {
          BUFFER_delete(*(BUFFER_HANDLE *)(l + 0x58));
        }
        pBVar3 = BUFFER_clone(*(BUFFER_HANDLE *)(l + 0x68));
        *(BUFFER_HANDLE *)(l + 0x58) = pBVar3;
        if (pBVar3 == (BUFFER_HANDLE)0x0) {
          l_4 = xlogging_get_log_function();
          if (l_4 != (LOGGER_LOG)0x0) {
            (*l_4)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                   ,"on_bytes_received",0x25e,1,"Failure cloning BUFFER.");
          }
          *(undefined4 *)(l + 0x4c) = 0xb;
        }
        else {
          *(undefined4 *)(l + 0x4c) = 7;
        }
      }
      else if (*(LOGGER_LOG *)(l + 0x60) < l_3) {
        iterator = (uchar *)xlogging_get_log_function();
        if ((LOGGER_LOG)iterator != (LOGGER_LOG)0x0) {
          (*(code *)iterator)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                              ,"on_bytes_received",0x268,1,
                              "Failure bytes encountered is greater then body length.");
        }
        *(undefined4 *)(l + 0x4c) = 0xb;
      }
    }
    if (*(int *)(l + 0x4c) == 6) {
      accural_len = (size_t)BUFFER_u_char(*(BUFFER_HANDLE *)(l + 0x68));
      end = (uchar *)accural_len;
      begin = (uchar *)accural_len;
      initial_pos = (uchar *)accural_len;
      data_length = BUFFER_length(*(BUFFER_HANDLE *)(l + 0x68));
      while (initial_pos < begin + data_length) {
        if (*initial_pos == '\r') {
          accural_len = (size_t)initial_pos;
          initial_pos = initial_pos + 1;
        }
        else if (*initial_pos == '\n') {
          hex_len = 0;
          l_5 = (LOGGER_LOG)(accural_len - (long)end);
          iVar1 = convert_char_to_hex(end,(size_t)l_5);
          hex_len = (size_t)iVar1;
          if (hex_len == 0) {
            if (data_length - (long)(initial_pos + (1 - (long)begin)) < 5) {
              *(undefined4 *)(l + 0x4c) = 7;
            }
            else {
              *(undefined4 *)(l + 0x4c) = 4;
            }
            break;
          }
          if (data_length - ((long)initial_pos - (long)begin) <= hex_len + 2) break;
          initial_pos = initial_pos + 1;
          iVar1 = BUFFER_append_build(*(BUFFER_HANDLE *)(l + 0x58),initial_pos,hex_len);
          if (iVar1 == 0) {
            if (begin + data_length < initial_pos + hex_len + 2) {
              l_7 = xlogging_get_log_function();
              if (l_7 != (LOGGER_LOG)0x0) {
                (*l_7)(AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                       ,"on_bytes_received",0x2a2,1,"Invalid length specified.");
              }
              *(undefined4 *)(l + 0x4c) = 0xb;
              break;
            }
            if (initial_pos + hex_len + 2 == begin + data_length) {
              iVar1 = BUFFER_shrink(*(BUFFER_HANDLE *)(l + 0x68),data_length,false);
              if (iVar1 != 0) {
                shrink_len = (size_t)xlogging_get_log_function();
                if ((LOGGER_LOG)shrink_len != (LOGGER_LOG)0x0) {
                  (*(code *)shrink_len)
                            (AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                             ,"on_bytes_received",0x2aa,1,"Failure shrinking accural buffer.");
                }
                *(undefined4 *)(l + 0x4c) = 0xb;
              }
              break;
            }
            initial_pos = initial_pos + hex_len + 2;
            if ((*initial_pos == '0') && (data_length - (long)(initial_pos + (1 - (long)begin)) < 5)
               ) {
              if (data_length - (long)(initial_pos + (1 - (long)begin)) < 5) {
                *(undefined4 *)(l + 0x4c) = 7;
              }
              else {
                *(undefined4 *)(l + 0x4c) = 4;
              }
              break;
            }
            l_8 = (LOGGER_LOG)(initial_pos + -(long)begin);
            if (l_8 != (LOGGER_LOG)0x0) {
              iVar1 = BUFFER_shrink(*(BUFFER_HANDLE *)(l + 0x68),(size_t)l_8,false);
              if (iVar1 == 0) {
                data_length = BUFFER_length(*(BUFFER_HANDLE *)(l + 0x68));
                begin = BUFFER_u_char(*(BUFFER_HANDLE *)(l + 0x68));
                initial_pos = begin;
              }
              else {
                reply_data = (uchar *)xlogging_get_log_function();
                if ((LOGGER_LOG)reply_data != (LOGGER_LOG)0x0) {
                  (*(code *)reply_data)
                            (AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                             ,"on_bytes_received",0x2ca,1,"Failure shrinking accrual buffer.");
                }
                *(undefined4 *)(l + 0x4c) = 0xb;
              }
            }
          }
          else {
            l_6 = xlogging_get_log_function();
            if (l_6 != (LOGGER_LOG)0x0) {
              (*l_6)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                     ,"on_bytes_received",0x29a,1,"Failure building buffer for chunked data.");
            }
            *(undefined4 *)(l + 0x4c) = 0xb;
          }
          accural_len = (size_t)initial_pos;
          end = initial_pos;
        }
        else {
          accural_len = (size_t)initial_pos;
          initial_pos = initial_pos + 1;
        }
      }
    }
    if ((*(int *)(l + 0x4c) == 7) || (*(int *)(l + 0x4c) == 0xb)) {
      reply_len = 0;
      sStack_108 = 0;
      l_9._4_4_ = 1;
      if (*(long *)(l + 0x58) != 0) {
        reply_len = (size_t)BUFFER_u_char(*(BUFFER_HANDLE *)(l + 0x58));
        sStack_108 = BUFFER_length(*(BUFFER_HANDLE *)(l + 0x58));
      }
      if (*(int *)(l + 0x4c) == 0xb) {
        l_9._4_4_ = 5;
      }
      if (((byte)l[0x79] & 1) != 0) {
        count = (size_t)xlogging_get_log_function();
        if ((LOGGER_LOG)count != (LOGGER_LOG)0x0) {
          in_stack_fffffffffffffea8 =
               (LOGGER_LOG)
               CONCAT44((int)((ulong)in_stack_fffffffffffffea8 >> 0x20),*(undefined4 *)(l + 0x48));
          (*(code *)count)(AZ_LOG_TRACE,
                           "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                           ,"on_bytes_received",0x2f4,1,"\r\nHTTP Status: %d\r\n",
                           in_stack_fffffffffffffea8);
        }
        HVar2 = HTTPHeaders_GetHeaderCount(*(HTTP_HEADERS_HANDLE *)(l + 0x50),&index_2);
        uVar5 = (undefined4)((ulong)in_stack_fffffffffffffea8 >> 0x20);
        if (HVar2 == HTTP_HEADERS_RESULT_INVALID) {
          for (header = (char *)0x0; uVar5 = (undefined4)((ulong)in_stack_fffffffffffffea8 >> 0x20),
              header < index_2; header = header + 1) {
            HVar2 = HTTPHeaders_GetHeader
                              (*(HTTP_HEADERS_HANDLE *)(l + 0x50),(size_t)header,(char **)&l_10);
            if (HVar2 == HTTP_HEADERS_OK) {
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 != (LOGGER_LOG)0x0) {
                in_stack_fffffffffffffea8 = l_10;
                (*p_Var4)(AZ_LOG_TRACE,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                          ,"on_bytes_received",0x2ff,1,"%s",l_10);
              }
              free(l_10);
            }
          }
        }
        if (((((byte)l[0x7a] & 1) != 0) && (sStack_108 != 0)) &&
           (p_Var4 = xlogging_get_log_function(), p_Var4 != (LOGGER_LOG)0x0)) {
          (*p_Var4)(AZ_LOG_TRACE,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                    ,"on_bytes_received",0x306,1,"\r\n%.*s\r\n",CONCAT44(uVar5,(int)sStack_108),
                    reply_len);
        }
      }
      (**(code **)(l + 0x38))
                (*(undefined8 *)(l + 0x40),l_9._4_4_,reply_len,sStack_108,*(undefined4 *)(l + 0x48),
                 *(undefined8 *)(l + 0x50));
      *(undefined4 *)(l + 0x4c) = 8;
    }
    if (*(int *)(l + 0x4c) == 8) {
      HTTPHeaders_Free(*(HTTP_HEADERS_HANDLE *)(l + 0x50));
      *(undefined8 *)(l + 0x50) = 0;
      BUFFER_delete(*(BUFFER_HANDLE *)(l + 0x58));
      *(undefined8 *)(l + 0x58) = 0;
      BUFFER_delete(*(BUFFER_HANDLE *)(l + 0x68));
      *(undefined8 *)(l + 0x68) = 0;
    }
  }
  return;
}

Assistant:

static void on_bytes_received(void* context, const unsigned char* buffer, size_t len)
{
    HTTP_CLIENT_HANDLE_DATA* http_data = (HTTP_CLIENT_HANDLE_DATA*)context;

    if (http_data != NULL && buffer != NULL && len > 0 && http_data->recv_msg.recv_state != state_error)
    {
        if (http_data->recv_msg.recv_state == state_parse_complete)
        {
            // The callback is getting called during a new send.
            setup_init_recv_msg(&http_data->recv_msg);

        }

        if (http_data->recv_msg.recv_state == state_initial || http_data->recv_msg.recv_state == state_open)
        {
            if (initialize_received_data(http_data) != 0)
            {
                http_data->recv_msg.recv_state = state_error;
            }
            else
            {
                http_data->recv_msg.recv_state = state_process_status_line;
            }
        }

        // Put the data in the buffer
        if (BUFFER_append_build(http_data->recv_msg.accrual_buff, buffer, len) != 0)
        {
            /* Codes_SRS_UHTTP_07_048: [ If any error is encountered on_bytes_received shall set the state to error. ] */
            LogError("Failure appending bytes to buffer.");
            http_data->recv_msg.recv_state = state_error;
        }

        if (http_data->recv_msg.recv_state == state_process_status_line)
        {
            size_t index = 0;
            const unsigned char* stored_bytes = BUFFER_u_char(http_data->recv_msg.accrual_buff);
            size_t stored_len = BUFFER_length(http_data->recv_msg.accrual_buff);

            int lineComplete = process_status_code_line(stored_bytes, stored_len, &index, &http_data->recv_msg.status_code);
            if (lineComplete == 0 && http_data->recv_msg.status_code > 0)
            {
                if (BUFFER_shrink(http_data->recv_msg.accrual_buff, index, false) != 0)
                {
                    LogError("Failure appending bytes to buffer.");
                    http_data->recv_msg.recv_state = state_error;
                }
                else
                {
                    http_data->recv_msg.recv_state = state_process_headers;
                }
            }
        }

        if (http_data->recv_msg.recv_state == state_process_headers)
        {
            size_t index = 0;
            const unsigned char* stored_bytes = BUFFER_u_char(http_data->recv_msg.accrual_buff);
            size_t stored_len = BUFFER_length(http_data->recv_msg.accrual_buff);

            int headerComplete = process_header_line(stored_bytes, stored_len, &index, http_data->recv_msg.resp_header, &http_data->recv_msg.total_body_len, &http_data->recv_msg.chunked_reply);
            if (headerComplete == 0)
            {
                if (http_data->recv_msg.total_body_len == 0)
                {
                    if (http_data->recv_msg.chunked_reply)
                    {

                        /* Codes_SRS_UHTTP_07_054: [ If the http header does not include a content length then it indicates a chunk response. ] */
                        http_data->recv_msg.recv_state = state_process_chunked_body;
                    }
                    else
                    {
                        // Content len is 0 so we are finished with the body
                        http_data->recv_msg.recv_state = state_send_user_callback;
                    }
                }
                else
                {
                    http_data->recv_msg.recv_state = state_process_body;
                }
            }
            if (index > 0)
            {
                if (BUFFER_shrink(http_data->recv_msg.accrual_buff, index, false) != 0)
                {
                    LogError("Failure appending bytes to buffer.");
                    http_data->recv_msg.recv_state = state_error;
                }
            }
        }

        if (http_data->recv_msg.recv_state == state_process_body)
        {
            if (http_data->recv_msg.total_body_len != 0)
            {
                size_t stored_len = BUFFER_length(http_data->recv_msg.accrual_buff);

                if ((http_data->recv_msg.total_body_len == stored_len) || (http_data->recv_msg.total_body_len == (stored_len - HTTP_END_TOKEN_LEN)))
                {
                    if (http_data->recv_msg.msg_body != NULL)
                    {
                        BUFFER_delete(http_data->recv_msg.msg_body);
                    }
                    if ((http_data->recv_msg.msg_body = BUFFER_clone(http_data->recv_msg.accrual_buff)) == NULL)
                    {
                        LogError("Failure cloning BUFFER.");
                        http_data->recv_msg.recv_state = state_error;
                    }
                    else
                    {
                        http_data->recv_msg.recv_state = state_send_user_callback;
                    }
                }
                else if (stored_len > http_data->recv_msg.total_body_len)
                {
                    LogError("Failure bytes encountered is greater then body length.");
                    http_data->recv_msg.recv_state = state_error;
                }
            }
        }

        if (http_data->recv_msg.recv_state == state_process_chunked_body)
        {
            const unsigned char* iterator = BUFFER_u_char(http_data->recv_msg.accrual_buff);
            const unsigned char* initial_pos = iterator;
            const unsigned char* begin = iterator;
            const unsigned char* end = iterator;
            size_t accural_len = BUFFER_length(http_data->recv_msg.accrual_buff);

            /* Codes_SRS_UHTTP_07_059: [ on_bytes_received shall loop throught the stored data to find the /r/n separator. ] */
            while (iterator < (initial_pos + accural_len))
            {
                if (*iterator == '\r')
                {
                    // Don't need anything
                    end = iterator;
                    iterator++;
                }
                else if (*iterator == '\n')
                {
                    size_t data_length = 0;

                    /* Codes_SRS_UHTTP_07_055: [ on_bytes_received shall convert the hexs length supplied in the response to the data length of the chunked data. ] */
                    size_t hex_len = end - begin;
                    data_length = convert_char_to_hex(begin, hex_len);
                    if (data_length == 0)
                    {
                        if (accural_len - (iterator - initial_pos + 1) <= HTTP_END_TOKEN_LEN)
                        {
                            http_data->recv_msg.recv_state = state_send_user_callback;
                        }
                        else
                        {
                            // Need to continue parsing
                            http_data->recv_msg.recv_state = state_process_headers;
                        }
                        break;
                    }
                    else if ((data_length + HTTP_CRLF_LEN) < accural_len - (iterator - initial_pos))
                    {
                        /* Codes_SRS_UHTTP_07_056: [ After the response chunk is parsed it shall be placed in a BUFFER_HANDLE. ] */
                        iterator += 1;
                        if (BUFFER_append_build(http_data->recv_msg.msg_body, iterator, data_length) != 0)
                        {
                            /* Codes_SRS_UHTTP_07_048: [ If any error is encountered on_bytes_received shall set the stop processing the request. ] */
                            LogError("Failure building buffer for chunked data.");
                            http_data->recv_msg.recv_state = state_error;
                        }
                        else
                        {
                            /* Codes_SRS_UHTTP_07_060: [ if the data_length specified in the chunk is beyond the amount of data recieved, the parsing shall end and wait for more data. ] */
                            if (iterator + (data_length + HTTP_CRLF_LEN) > initial_pos + accural_len)
                            {
                                LogError("Invalid length specified.");
                                http_data->recv_msg.recv_state = state_error;
                                break;
                            }
                            else if (iterator + (data_length + HTTP_CRLF_LEN) == initial_pos + accural_len)
                            {
                                if (BUFFER_shrink(http_data->recv_msg.accrual_buff, accural_len, false) != 0)
                                {
                                    LogError("Failure shrinking accural buffer.");
                                    http_data->recv_msg.recv_state = state_error;
                                }
                                break;
                            }
                            else
                            {
                                // Move the iterator beyond the data we read and the /r/n
                                iterator += (data_length + HTTP_CRLF_LEN);
                            }

                            /* Codes_SRS_UHTTP_07_058: [ Once a chunk size value of 0 is encountered on_bytes_received shall call the on_request_callback with the http message ] */
                            if (*iterator == '0' && (accural_len - (iterator - initial_pos + 1) <= HTTP_END_TOKEN_LEN))
                            {
                                if (accural_len - (iterator - initial_pos + 1) <= HTTP_END_TOKEN_LEN)
                                {
                                    http_data->recv_msg.recv_state = state_send_user_callback;
                                }
                                else
                                {
                                    // Need to continue parsing
                                    http_data->recv_msg.recv_state = state_process_headers;
                                }
                                break;
                            }
                            else
                            {
                                size_t shrink_len = iterator - initial_pos;
                                if (shrink_len > 0)
                                {
                                    if (BUFFER_shrink(http_data->recv_msg.accrual_buff, shrink_len, false) != 0)
                                    {
                                        LogError("Failure shrinking accrual buffer.");
                                        http_data->recv_msg.recv_state = state_error;
                                    }
                                    else
                                    {
                                        accural_len = BUFFER_length(http_data->recv_msg.accrual_buff);
                                        initial_pos = iterator = BUFFER_u_char(http_data->recv_msg.accrual_buff);
                                    }
                                }
                            }
                        }
                        begin = end = iterator;
                    }
                    else
                    {
                        break;
                    }
                }
                else
                {
                    end = iterator;
                    iterator++;
                }
            }
        }

        if (http_data->recv_msg.recv_state == state_send_user_callback || http_data->recv_msg.recv_state == state_error)
        {
            const unsigned char* reply_data = NULL;
            size_t reply_len = 0;
            HTTP_CALLBACK_REASON http_reason = HTTP_CALLBACK_REASON_OK;
            if (http_data->recv_msg.msg_body != NULL)
            {
                reply_data = BUFFER_u_char(http_data->recv_msg.msg_body);
                reply_len = BUFFER_length(http_data->recv_msg.msg_body);
            }
            if (http_data->recv_msg.recv_state == state_error)
            {
                http_reason = HTTP_CALLBACK_REASON_PARSING_ERROR;
            }
            if (http_data->trace_on)
            {
                LOG(AZ_LOG_TRACE, LOG_LINE, "\r\nHTTP Status: %d\r\n", http_data->recv_msg.status_code);

                // Loop through headers
                size_t count;
                if (HTTPHeaders_GetHeaderCount(http_data->recv_msg.resp_header, &count) == 0)
                {
                    for (size_t index = 0; index < count; index++)
                    {
                        char* header;
                        if (HTTPHeaders_GetHeader(http_data->recv_msg.resp_header, index, &header) == HTTP_HEADERS_OK)
                        {
                            LOG(AZ_LOG_TRACE, LOG_LINE, "%s", header);
                            free(header);
                        }
                    }
                }
                if (http_data->trace_body && reply_len > 0)
                {
                    LOG(AZ_LOG_TRACE, LOG_LINE, "\r\n%.*s\r\n", (int)reply_len, reply_data);
                }
            }
            http_data->recv_msg.on_request_callback(http_data->recv_msg.user_ctx, http_reason, reply_data, reply_len, http_data->recv_msg.status_code, http_data->recv_msg.resp_header);
            http_data->recv_msg.recv_state = state_parse_complete;
        }

        if (http_data->recv_msg.recv_state == state_parse_complete)
        {
            HTTPHeaders_Free(http_data->recv_msg.resp_header);
            http_data->recv_msg.resp_header = NULL;
            BUFFER_delete(http_data->recv_msg.msg_body);
            http_data->recv_msg.msg_body = NULL;
            BUFFER_delete(http_data->recv_msg.accrual_buff);
            http_data->recv_msg.accrual_buff = NULL;
        }
    }
}